

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> * __thiscall
Cipher::Processor::getClusterings(Processor *this,int nClusterings)

{
  float fVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  iterator iVar12;
  iterator iVar13;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *in_RDI;
  float fVar14;
  double dVar15;
  pointer piVar16;
  double dVar17;
  double pDiff;
  int k;
  double pDiffMin;
  int j_1;
  double pDiffMax;
  int jBest;
  int i_1;
  double pClustersBest;
  double pAccept;
  int i;
  int j;
  double pNew;
  value_type old;
  int idxChanged;
  double pScale;
  double alpha;
  double TMin;
  double T;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> all;
  int n;
  TClusters clustersNew;
  int nTotalIterations;
  int nNoImprovement;
  double p0;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *result;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *in_stack_fffffffffffffe88;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *in_stack_fffffffffffffea0;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  int local_e4;
  double local_e0;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  double dVar18;
  int local_c4;
  int local_c0;
  int local_a8;
  double local_a0;
  double local_78;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> local_60;
  int local_44;
  vector<int,_std::allocator<int>_> local_40;
  int local_28;
  int local_24;
  pointer local_20;
  int local_14;
  
  local_20 = in_RSI[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
  local_24 = 0;
  local_28 = 0;
  this_01 = &local_40;
  local_14 = in_EDX;
  std::vector<int,_std::allocator<int>_>::vector(this_01,in_RSI);
  sVar7 = std::vector<int,_std::allocator<int>_>::size(this_01);
  local_44 = (int)sVar7;
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::vector
            ((vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *)0x151269);
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
            (in_stack_fffffffffffffea0,
             (value_type *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  local_78 = (double)*(float *)&in_RSI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
  fVar1 = *(float *)((long)&in_RSI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 4);
  dVar15 = (double)(local_44 * (local_44 + -1)) / 2.0;
  do {
    std::vector<int,_std::allocator<int>_>::operator=
              (in_stack_ffffffffffffff30,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    iVar4 = rand();
    iVar4 = iVar4 % local_44;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)iVar4);
    iVar6 = *pvVar8;
    do {
      iVar5 = rand();
      iVar2 = *(int *)((long)&(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start + 4);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)iVar4);
      *pvVar8 = iVar5 % (iVar2 + -1) + 1;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)iVar4);
    } while (*pvVar8 == iVar6);
    local_a0 = (double)in_RSI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish * dVar15;
    for (local_a8 = 0; local_a8 < local_44; local_a8 = local_a8 + 1) {
      if (local_a8 != iVar4) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &in_RSI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)local_a8);
        iVar6 = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &in_RSI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)iVar4);
        if (iVar6 == *pvVar8) {
          pvVar9 = std::
                   vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   ::operator[]((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                 *)(in_RSI + 4),(long)iVar4);
          pvVar10 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[]
                              (pvVar9,(long)local_a8);
          dVar18 = pvVar10->cc;
        }
        else {
          pvVar9 = std::
                   vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   ::operator[]((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                 *)(in_RSI + 5),(long)iVar4);
          pvVar10 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[]
                              (pvVar9,(long)local_a8);
          dVar18 = pvVar10->cc;
        }
        local_a0 = local_a0 - dVar18;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_a8);
        iVar6 = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)iVar4);
        if (iVar6 == *pvVar8) {
          pvVar9 = std::
                   vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   ::operator[]((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                 *)(in_RSI + 4),(long)iVar4);
          pvVar10 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[]
                              (pvVar9,(long)local_a8);
          dVar18 = pvVar10->cc;
        }
        else {
          pvVar9 = std::
                   vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   ::operator[]((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                 *)(in_RSI + 5),(long)iVar4);
          pvVar10 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[]
                              (pvVar9,(long)local_a8);
          dVar18 = pvVar10->cc;
        }
        local_a0 = dVar18 + local_a0;
      }
    }
    piVar16 = (pointer)(local_a0 / dVar15);
    if ((double)piVar16 <
        (double)in_RSI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
      dVar18 = exp(((double)piVar16 -
                   (double)in_RSI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish) / local_78);
      fVar14 = frand();
      if ((double)fVar14 < dVar18) {
        std::vector<int,_std::allocator<int>_>::operator=
                  (in_stack_ffffffffffffff30,
                   (vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        in_RSI[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar16;
        in_RSI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar16;
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::operator=
                (in_stack_ffffffffffffff30,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      in_RSI[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar16;
      in_RSI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar16;
    }
    piVar16 = in_RSI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pvVar11 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::back
                        (in_stack_fffffffffffffe90);
    if ((double)piVar16 < pvVar11->pClusters || (double)piVar16 == pvVar11->pClusters) {
      local_24 = local_24 + 1;
    }
    else {
      std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
                (in_stack_fffffffffffffea0,
                 (value_type *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      local_24 = 0;
    }
    local_28 = local_28 + 1;
    if ((local_28 % 1000 == 0) && (local_78 = local_78 * (double)fVar1, local_78 < 1e-06)) {
      local_78 = 1e-06;
    }
  } while ((local_24 < 0x3e9) || (2e-06 <= local_78));
  this_00 = &local_60;
  pvVar11 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::back
                      (in_stack_fffffffffffffe90);
  dVar15 = pvVar11->pClusters;
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::vector
            ((vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *)0x1517f2);
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::back(in_stack_fffffffffffffe90);
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
            (this_00,(value_type *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  for (local_c0 = 1; local_c0 < local_14; local_c0 = local_c0 + 1) {
    local_c4 = -1;
    dVar18 = -1.0;
    sVar7 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::size(&local_60);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar7 * 5;
    iVar6 = SUB164(auVar3 / ZEXT816(6),0);
    while (iVar4 = iVar6,
          sVar7 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::size(&local_60),
          iVar6 < (int)sVar7) {
      pvVar11 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::operator[]
                          (&local_60,(long)iVar4);
      if (dVar15 * 1.1 <= pvVar11->pClusters) {
        local_e0 = std::numeric_limits<double>::max();
        local_e4 = 0;
        while (in_stack_fffffffffffffe98 = local_e4,
              sVar7 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::size(in_RDI),
              in_stack_fffffffffffffe98 < (int)sVar7) {
          pvVar11 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::operator[]
                              (&local_60,(long)iVar4);
          dVar17 = pvVar11->pClusters;
          pvVar11 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::operator[]
                              (in_RDI,(long)local_e4);
          dVar17 = ABS(dVar17 - pvVar11->pClusters);
          if (dVar17 < local_e0) {
            local_e0 = dVar17;
          }
          local_e4 = local_e4 + 1;
        }
        if (dVar18 < local_e0) {
          dVar18 = local_e0;
          local_c4 = iVar4;
        }
      }
      iVar6 = iVar4 + 1;
    }
    if ((dVar18 < 0.005) || (local_c4 == -1)) break;
    std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::operator[]
              (&local_60,(long)local_c4);
    std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
              (this_00,(value_type *)CONCAT44(iVar6,in_stack_fffffffffffffe98));
  }
  iVar12 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::begin
                     (in_stack_fffffffffffffe88);
  iVar13 = std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::end
                     (in_stack_fffffffffffffe88);
  std::
  sort<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,Cipher::Processor::getClusterings(int)::__0>
            (iVar12._M_current,iVar13._M_current);
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::~vector(this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return in_RDI;
}

Assistant:

std::vector<TResult> Processor::getClusterings(int nClusterings) {
        const auto p0 = m_curResult.pClusters;
        //printf("    [getClusterings] p0 = %g\n", p0);

        int nNoImprovement = 0;
        int nTotalIterations = 0;
        auto clustersNew = m_curResult.clusters;
        const int n = clustersNew.size();

        std::vector<TResult> all;
        all.push_back(m_curResult);

        // simulated annealing
        double T = m_params.temp0;
        const double TMin = 0.000001;
        const double alpha = m_params.coolingRate;
        const double pScale = ((n*(n-1))/2.0);

        while (true) {
            clustersNew = m_curResult.clusters;

            // mutate
            int idxChanged = -1;
            {
                idxChanged = rand()%n;

                auto old = clustersNew[idxChanged];
                do {
                    clustersNew[idxChanged] = 1 + rand()%(m_params.maxClusters - 1);
                } while (clustersNew[idxChanged] == old);
            }

            // compute pNew
            auto pNew = m_pCur*pScale;
            {
                const int j = idxChanged;
                for (int i = 0; i < n; ++i) {
                    if (i == j) {
                        continue;
                    }

                    if (m_curResult.clusters[i] == m_curResult.clusters[j]) {
                        pNew -= m_logMap[j][i].cc;
                    } else {
                        pNew -= m_logMapInv[j][i].cc;
                    }

                    if (clustersNew[i] == clustersNew[j]) {
                        pNew += m_logMap[j][i].cc;
                    } else {
                        pNew += m_logMapInv[j][i].cc;
                    }
                }

                pNew /= pScale;
            }

            // check if we should accept the new value
            if (pNew >= m_pCur) {
                m_curResult.clusters = clustersNew;
                m_curResult.pClusters = pNew;
                m_pCur = pNew;
            } else {
                // accept with probability
                const auto pAccept = std::exp((pNew - m_pCur)/T);
                if (pAccept > frand()) {
                    //printf("    [getClusterings] N = %5d, T = %8.8f, pNew = %g, pCur = %g, pAccept = %g\n", nNoImprovement, T, pNew, m_pCur, pAccept);
                    m_curResult.clusters = clustersNew;
                    m_curResult.pClusters = pNew;
                    m_pCur = pNew;
                }
            }

            // check if we should stop
            if (m_pCur > all.back().pClusters) {
                all.push_back(m_curResult);
                nNoImprovement = 0;
            } else {
                nNoImprovement += 1;
            }

            // update temperature
            nTotalIterations++;
            if (nTotalIterations % 1000 == 0) {
                T = T * alpha;
                if (T < TMin) {
                    T = TMin;
                }
                //printf("    [getClusterings] T = %g\n", T);
            }

            if (nNoImprovement > 1000 && T < 2*TMin) {
                break;
            }
        }

        //printf("    [getClusterings] nTotalIterations = %d\n", nTotalIterations);
        //printf("    [getClusterings] pFinal = %g\n", m_curResult.pClusters);

        const auto pClustersBest = all.back().pClusters;

        std::vector<TResult> result;
        {
            result.push_back(all.back());

            for (int i = 1; i < nClusterings; ++i) {
                int jBest = -1;
                double pDiffMax = -1.0;
                for (int j = 5*all.size()/6; j < (int) all.size(); ++j) {
                    if (all[j].pClusters < 1.1*pClustersBest) {
                        continue;
                    }
                    double pDiffMin = std::numeric_limits<double>::max();
                    for (int k = 0; k < (int) result.size(); ++k) {
                        double pDiff = std::fabs(all[j].pClusters - result[k].pClusters);
                        if (pDiffMin > pDiff) {
                            pDiffMin = pDiff;
                        }
                    }
                    if (pDiffMax < pDiffMin) {
                        pDiffMax = pDiffMin;
                        jBest = j;
                    }
                }

                if (pDiffMax < 0.005 || jBest == -1) {
                    break;
                }

                result.push_back(all[jBest]);
            }
        }

        std::sort(result.begin(), result.end(), [](const TResult & a, const TResult & b) {
            return a.pClusters > b.pClusters;
        });

        return result;
    }